

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O0

void __thiscall Assimp::AMFImporter::Throw_IncorrectAttr(AMFImporter *this,string *pAttrName)

{
  int iVar1;
  DeadlyImportError *this_00;
  undefined4 extraout_var;
  allocator local_c5 [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *pAttrName_local;
  AMFImporter *this_local;
  
  local_18 = pAttrName;
  pAttrName_local = (string *)this;
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,(char *)CONCAT44(extraout_var,iVar1),local_c5);
  std::operator+(&local_98,"Node <",&local_b8);
  std::operator+(&local_78,&local_98,"> has incorrect attribute \"");
  std::operator+(&local_58,&local_78,local_18);
  std::operator+(&local_38,&local_58,"\".");
  DeadlyImportError::DeadlyImportError(this_00,&local_38);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void AMFImporter::Throw_IncorrectAttr(const std::string& pAttrName)
{
	throw DeadlyImportError("Node <" + std::string(mReader->getNodeName()) + "> has incorrect attribute \"" + pAttrName + "\".");
}